

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::QPDFWriter(QPDFWriter *this,QPDF *pdf,char *filename)

{
  Members *this_00;
  
  this_00 = (Members *)operator_new(0x430);
  Members::Members(this_00,pdf);
  std::__shared_ptr<QPDFWriter::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFWriter::Members,void>
            ((__shared_ptr<QPDFWriter::Members,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  setOutputFilename(this,filename);
  return;
}

Assistant:

QPDFWriter::QPDFWriter(QPDF& pdf, char const* filename) :
    m(new Members(pdf))
{
    setOutputFilename(filename);
}